

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O1

uint64_t GDSfloatCalc(double inVar)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  if ((inVar == 0.0) && (!NAN(inVar))) {
    return 0;
  }
  dVar8 = -inVar;
  if (-inVar <= inVar) {
    dVar8 = inVar;
  }
  uVar2 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
  auVar9._8_4_ = (int)(uVar2 >> 0x20);
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = 0x45300000;
  dVar8 = dVar8 - ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  lVar1 = 0x3f;
  uVar5 = 0;
  do {
    dVar8 = dVar8 + dVar8;
    uVar6 = 0;
    if (1.0 <= dVar8) {
      uVar6 = 1L << ((byte)lVar1 & 0x3f);
    }
    uVar5 = uVar6 | uVar5;
    dVar8 = (double)((ulong)dVar8 & -(ulong)(dVar8 < 1.0) |
                    ~-(ulong)(dVar8 < 1.0) & (ulong)(dVar8 + -1.0));
    bVar7 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (((dVar8 != 0.0) || (NAN(dVar8))) && (bVar7));
  uVar6 = 0x5000000000000000;
  if (uVar2 >> 0x3b == 0) {
    lVar1 = 0x3c;
    uVar3 = uVar2;
    do {
      uVar6 = uVar6 + 0xff00000000000000;
      uVar2 = (ulong)((uint)(uVar5 >> ((byte)lVar1 & 0x3f)) & 0xf) | uVar3 << 4;
      if (lVar1 == 0) break;
      lVar1 = lVar1 + -4;
      uVar4 = uVar3 >> 0x37;
      uVar3 = uVar2;
    } while (uVar4 == 0);
  }
  return uVar2 >> 8 | uVar6 | (ulong)(inVar < 0.0) << 0x3f;
}

Assistant:

uint64_t GDSfloatCalc(double inVar)
{
  uint64_t GDSdec = 0;
  unsigned long long integral;
  double deci;
  unsigned long long sign = 0;
  unsigned long long exponent = 80;
  unsigned long long mantissa = 0;

  if (inVar == 0)
    return 0;

  if (inVar < 0) {
    inVar *= -1;
    sign = 1;
  }

  integral = inVar;
  deci = inVar - integral;

  // Calculating the decimal
  for (int i = 63; i >= 0; i--) {
    deci *= 2;
    if (deci >= 1) {
      GDSdec = GDSdec | bitShiftL(1, i);
      deci--;
    }
    if (deci == 0)
      break;
  }

  mantissa = integral;
  for (int i = 15; i >= 0; i--) {
    if ((bitShiftR(mantissa, 59) & 0xffff) > 0)
      break;
    mantissa = mantissa << 4;
    exponent--;
    mantissa = mantissa | (bitShiftR(GDSdec, 4 * i) & 0xf);
  }

  sign = bitShiftL(sign, 63);
  exponent = bitShiftL(exponent, 56);
  mantissa = bitShiftR(mantissa, 8);

  return sign | exponent | mantissa;
}